

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O2

Literal __thiscall Satyricon::SATSolver::choice_lit(SATSolver *this)

{
  uint uVar1;
  Literal LVar2;
  uint uVar3;
  
  if ((this->param).enable_random_choice == true) {
    uVar1 = random_kiss(this);
    if (uVar1 % 100 == 0) {
      do {
        uVar1 = random_kiss(this);
        uVar1 = uVar1 % this->number_of_variable;
      } while ((this->values).
               super__Vector_base<Satyricon::literal_value,_std::allocator<Satyricon::literal_value>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)uVar1] != LIT_UNASIGNED);
      uVar3 = random_kiss(this);
      return (Literal)((uVar3 & 1) + uVar1 * 2);
    }
  }
  LVar2 = Literal_Order::decision(&this->order);
  return (Literal)LVar2.value;
}

Assistant:

Literal SATSolver::choice_lit() {

    // random choice 1% of times
    if ( param.enable_random_choice &&  random() % 100 == 0 ) {
        int val;
        do {
            val = random() % number_of_variable;
        } while ( values[val] != LIT_UNASIGNED );
        return Literal ( val,static_cast<bool>(random() % 2) ) ;
    }

    // otherwise select from order
    return order.decision();
}